

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCRgba.cpp
# Opt level: O2

void anon_unknown.dwarf_2684e2::writeReadCRGBA
               (char *fileName,int width,int height,Array2D<ImfRgba> *p1,RgbaChannels channels,
               LineOrder lorder,Compression comp)

{
  ImfHalf IVar1;
  uint __line;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined4 in_register_00000034;
  Array2D<ImfRgba> *ImfRgbaPixels;
  char *pcVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int h;
  long lVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  int yMin;
  Array2D<ImfRgba> p2;
  float yScreenWindowCenter;
  float xScreenWindowCenter;
  int yMaxDisplayWindow;
  int xMaxDisplayWindow;
  int yMinDisplayWindow;
  int xMinDisplayWindow;
  int yMaxDataWindow;
  int xMaxDataWindow;
  int yMinDataWindow;
  int xMinDataWindow;
  int yMax;
  float yScreenWindowCenterOut;
  float xScreenWindowCenterOut;
  Array2D<Imf_3_4::Rgba> p2_temp;
  Array2D<Imf_3_4::Rgba> p1_temp;
  int xMax;
  int xMin;
  
  ImfRgbaPixels = (Array2D<ImfRgba> *)CONCAT44(in_register_00000034,width);
  poVar4 = std::operator<<((ostream *)&std::cout,"channels ");
  pcVar11 = "R";
  if ((height & 1U) == 0) {
    pcVar11 = "";
  }
  poVar4 = std::operator<<(poVar4,pcVar11);
  pcVar11 = "G";
  if ((height & 2U) == 0) {
    pcVar11 = "";
  }
  poVar4 = std::operator<<(poVar4,pcVar11);
  pcVar11 = "B";
  if ((height & 4U) == 0) {
    pcVar11 = "";
  }
  poVar4 = std::operator<<(poVar4,pcVar11);
  pcVar11 = "A";
  if ((height & 8U) == 0) {
    pcVar11 = "";
  }
  poVar4 = std::operator<<(poVar4,pcVar11);
  poVar4 = std::operator<<(poVar4,", line order ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)p1);
  poVar4 = std::operator<<(poVar4,", compression ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,channels);
  std::endl<char,std::char_traits<char>>(poVar4);
  uVar5 = ImfNewHeader();
  ImfHeaderSetLineOrder(uVar5,(ulong)p1 & 0xffffffff);
  ImfHeaderSetCompression(uVar5,channels);
  ImfHeaderSetDataWindow(uVar5,0,0,0xec,0x76);
  ImfHeaderSetDisplayWindow(uVar5,0,0,0xec,0x76);
  ImfHeaderScreenWindowCenter(uVar5,&xScreenWindowCenterOut,&yScreenWindowCenterOut);
  std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::flush();
  remove(fileName);
  uVar6 = ImfOpenOutputFile(fileName,uVar5,height);
  ImfOutputSetFrameBuffer(uVar6,ImfRgbaPixels->_data,1,0xed);
  ImfOutputWritePixels(uVar6,0x77);
  iVar2 = ImfCloseOutputFile(uVar6);
  if (iVar2 != 1) {
    pcVar11 = "outputFileClosed == 1";
    __line = 0x6e;
LAB_0017dbc0:
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,__line,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  std::operator<<((ostream *)&std::cout,"reading ");
  std::ostream::flush();
  lVar7 = ImfOpenInputFile(fileName);
  if (lVar7 == 0) {
    pcVar11 = "in != NULL";
    __line = 0x76;
    goto LAB_0017dbc0;
  }
  uVar6 = ImfInputHeader(lVar7);
  ImfHeaderDataWindow(uVar6,&xMin,&yMin,&xMax,&yMax);
  lVar15 = (long)xMax - (long)xMin;
  lVar8 = lVar15 + 1;
  lVar9 = (long)yMin;
  lVar13 = yMax - lVar9;
  lVar10 = lVar13 + 1;
  Imf_3_4::Array2D<ImfRgba>::Array2D(&p2,lVar10,lVar8);
  lVar16 = (long)(int)lVar15;
  lVar14 = (long)(int)lVar13;
  lVar13 = 0;
  for (lVar15 = 0; lVar15 <= lVar14; lVar15 = lVar15 + 1) {
    for (lVar12 = 0; lVar12 <= lVar16; lVar12 = lVar12 + 1) {
      *(undefined8 *)((long)&p2._data[lVar12].r + p2._sizeY * lVar13) = 0x1000000000000;
    }
    lVar13 = lVar13 + 8;
  }
  iVar2 = ImfInputSetFrameBuffer(lVar7,p2._data + (-lVar9 * p2._sizeY - (long)xMin),1,lVar8);
  if (iVar2 != 1) {
    __assert_fail("successSetFrameBuffer == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0x89,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  iVar2 = ImfInputReadPixels(lVar7,yMin,yMax);
  if (iVar2 != 1) {
    __assert_fail("successReadPixels == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0x8b,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  ImfHeaderDataWindow(uVar6,&xMinDataWindow,&yMinDataWindow,&xMaxDataWindow,&yMaxDataWindow);
  ImfHeaderDisplayWindow
            (uVar6,&xMinDisplayWindow,&yMinDisplayWindow,&xMaxDisplayWindow,&yMaxDisplayWindow);
  ImfHeaderScreenWindowCenter(uVar6,&xScreenWindowCenter,&yScreenWindowCenter);
  if ((((xMinDisplayWindow != 0) || (yMinDisplayWindow != 0)) || (xMaxDisplayWindow != 0xec)) ||
     (yMaxDisplayWindow != 0x76)) {
    __assert_fail("(xMinDisplayWindow == 0) && (yMinDisplayWindow == 0) && (xMaxDisplayWindow == width - 1) && (yMaxDisplayWindow == height - 1)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0x9a,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  if (((xMinDataWindow != 0) || (yMinDataWindow != 0)) ||
     ((xMaxDataWindow != 0xec || (yMaxDataWindow != 0x76)))) {
    __assert_fail("(xMinDataWindow == 0) && (yMinDataWindow == 0) && (xMaxDataWindow == width - 1) && (yMaxDataWindow == height - 1)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0x9c,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  fVar17 = (float)ImfHeaderPixelAspectRatio(uVar6);
  fVar18 = (float)ImfHeaderPixelAspectRatio(uVar5);
  if ((fVar17 != fVar18) || (NAN(fVar17) || NAN(fVar18))) {
    __assert_fail("ImfHeaderPixelAspectRatio(inputFileHeaderPtr) == ImfHeaderPixelAspectRatio (headerPtr)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0x9e,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  if ((((xScreenWindowCenter != xScreenWindowCenterOut) ||
       (NAN(xScreenWindowCenter) || NAN(xScreenWindowCenterOut))) ||
      (yScreenWindowCenter != yScreenWindowCenterOut)) ||
     (NAN(yScreenWindowCenter) || NAN(yScreenWindowCenterOut))) {
    __assert_fail("(xScreenWindowCenter == xScreenWindowCenterOut) && (yScreenWindowCenter == yScreenWindowCenterOut)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0xa0,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  fVar17 = (float)ImfHeaderScreenWindowWidth(uVar6);
  fVar18 = (float)ImfHeaderScreenWindowWidth(uVar5);
  if ((fVar17 != fVar18) || (NAN(fVar17) || NAN(fVar18))) {
    __assert_fail("ImfHeaderScreenWindowWidth (inputFileHeaderPtr) == ImfHeaderScreenWindowWidth (headerPtr)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0xa2,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  iVar2 = ImfHeaderLineOrder(uVar6);
  iVar3 = ImfHeaderLineOrder(uVar5);
  if (iVar2 != iVar3) {
    __assert_fail("ImfHeaderLineOrder (inputFileHeaderPtr) == ImfHeaderLineOrder (headerPtr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0xa4,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  iVar2 = ImfHeaderCompression(uVar6);
  iVar3 = ImfHeaderCompression(uVar5);
  if (iVar2 != iVar3) {
    __assert_fail("ImfHeaderCompression (inputFileHeaderPtr) == ImfHeaderCompression (headerPtr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0xa6,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  iVar2 = ImfInputChannels(lVar7);
  if (iVar2 != height) {
    __assert_fail("ImfInputChannels (in) == channels",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0xa8,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  iVar2 = ImfHeaderCompression(uVar6);
  iVar3 = (int)lVar8;
  h = (int)lVar10;
  if ((iVar2 == 6) || (iVar2 = ImfHeaderCompression(uVar6), iVar2 == 7)) {
    Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D(&p1_temp,lVar10,lVar8);
    Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D(&p2_temp,lVar10,lVar8);
    convertImfRgbaToRgbaPixels(ImfRgbaPixels,&p1_temp,iVar3,h);
    convertImfRgbaToRgbaPixels(&p2,&p2_temp,iVar3,h);
    compareB44(0xed,0x77,&p1_temp,&p2_temp,height);
  }
  else {
    iVar2 = ImfHeaderCompression(uVar6);
    if ((iVar2 != 8) && (iVar2 = ImfHeaderCompression(uVar6), iVar2 != 9)) {
      lVar10 = 0;
      for (lVar8 = 0; lVar8 <= lVar14; lVar8 = lVar8 + 1) {
        for (lVar13 = 0; lVar13 <= lVar16; lVar13 = lVar13 + 1) {
          IVar1 = *(ImfHalf *)((long)&p2._data[lVar13].r + p2._sizeY * lVar10);
          if ((height & 1U) == 0) {
            fVar17 = (float)ImfHalfToFloat(IVar1);
            if ((fVar17 != 0.0) || (NAN(fVar17))) {
              __assert_fail("ImfHalfToFloat(p2[y][x].r) == 0.0",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                            ,0xc6,
                            "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                           );
            }
          }
          else if (IVar1 != *(ImfHalf *)
                             ((long)&ImfRgbaPixels->_data[lVar13].r + ImfRgbaPixels->_sizeY * lVar10
                             )) {
            __assert_fail("p2[y][x].r == p1[y][x].r",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                          ,0xc4,
                          "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                         );
          }
          IVar1 = *(ImfHalf *)((long)&p2._data[lVar13].g + p2._sizeY * lVar10);
          if ((height & 2U) == 0) {
            fVar17 = (float)ImfHalfToFloat(IVar1);
            if ((fVar17 != 0.0) || (NAN(fVar17))) {
              __assert_fail("ImfHalfToFloat(p2[y][x].g) == 0.0",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                            ,0xcb,
                            "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                           );
            }
          }
          else if (IVar1 != *(ImfHalf *)
                             ((long)&ImfRgbaPixels->_data[lVar13].g + ImfRgbaPixels->_sizeY * lVar10
                             )) {
            __assert_fail("p2[y][x].g == p1[y][x].g",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                          ,0xc9,
                          "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                         );
          }
          IVar1 = *(ImfHalf *)((long)&p2._data[lVar13].b + p2._sizeY * lVar10);
          if ((height & 4U) == 0) {
            fVar17 = (float)ImfHalfToFloat(IVar1);
            if ((fVar17 != 0.0) || (NAN(fVar17))) {
              __assert_fail("ImfHalfToFloat(p2[y][x].b) == 0.0",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                            ,0xd0,
                            "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                           );
            }
          }
          else if (IVar1 != *(ImfHalf *)
                             ((long)&ImfRgbaPixels->_data[lVar13].b + ImfRgbaPixels->_sizeY * lVar10
                             )) {
            __assert_fail("p2[y][x].b == p1[y][x].b",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                          ,0xce,
                          "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                         );
          }
          IVar1 = *(ImfHalf *)((long)&p2._data[lVar13].a + p2._sizeY * lVar10);
          if ((height & 8U) == 0) {
            fVar17 = (float)ImfHalfToFloat(IVar1);
            if ((fVar17 != 1.0) || (NAN(fVar17))) {
              __assert_fail("ImfHalfToFloat(p2[y][x].a) == 1.0",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                            ,0xd5,
                            "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                           );
            }
          }
          else if (IVar1 != *(ImfHalf *)
                             ((long)&ImfRgbaPixels->_data[lVar13].a + ImfRgbaPixels->_sizeY * lVar10
                             )) {
            __assert_fail("p2[y][x].a == p1[y][x].a",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                          ,0xd3,
                          "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                         );
          }
        }
        lVar10 = lVar10 + 8;
      }
      goto LAB_0017d84e;
    }
    Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D(&p1_temp,lVar10,lVar8);
    Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D(&p2_temp,lVar10,lVar8);
    convertImfRgbaToRgbaPixels(ImfRgbaPixels,&p1_temp,iVar3,h);
    convertImfRgbaToRgbaPixels(&p2,&p2_temp,iVar3,h);
    compareDwa(0xed,0x77,&p1_temp,&p2_temp,height);
  }
  Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D(&p2_temp);
  Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D(&p1_temp);
LAB_0017d84e:
  iVar2 = ImfCloseInputFile(lVar7);
  if (iVar2 != 1) {
    __assert_fail("inputFileClosed == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0xdb,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  Imf_3_4::Array2D<ImfRgba>::~Array2D(&p2);
  ImfDeleteHeader(uVar5);
  remove(fileName);
  return;
}

Assistant:

void
writeReadCRGBA (
    const char           fileName[],
    int                  width,
    int                  height,
    const Array2D<ImfRgba>& p1,
    RgbaChannels         channels,
    LineOrder            lorder,
    Compression          comp)
{
    // 
    // Save the selected channels of RGBA image p1; save the
    // scan lines in the specified order.  Read the image back
    // from the file, and compare the data with the original.
    //

    cout << "channels " << ((channels & IMF_WRITE_R) ? "R" : "")
         << ((channels & IMF_WRITE_G) ? "G" : "")
         << ((channels & IMF_WRITE_B) ? "B" : "")
         << ((channels & IMF_WRITE_A) ? "A" : "") << ", line order " << lorder
         << ", compression " << comp << endl;

    ImfHeader* headerPtr = ImfNewHeader ();
    ImfHeaderSetLineOrder (headerPtr, lorder);
    ImfHeaderSetCompression (headerPtr, comp);
    ImfHeaderSetDataWindow (headerPtr, 0, 0, width - 1, height - 1);
    ImfHeaderSetDisplayWindow (headerPtr, 0, 0, width - 1, height - 1);

    // Get screenWindowCenter for comparison
    float xScreenWindowCenterOut, yScreenWindowCenterOut;
    ImfHeaderScreenWindowCenter (headerPtr, &xScreenWindowCenterOut, &yScreenWindowCenterOut);

    cout << "writing ";
    cout.flush ();

    {
        remove (fileName);
        ImfOutputFile* out = ImfOpenOutputFile (fileName, headerPtr, channels);
        ImfOutputSetFrameBuffer (out, &p1[0][0], 1, width);
        ImfOutputWritePixels (out, height);
        int outputFileClosed = ImfCloseOutputFile (out);
        assert (outputFileClosed == 1);
    }

    cout << "reading ";
    cout.flush ();

    {
        ImfInputFile* in = ImfOpenInputFile (fileName);
        assert (in != NULL);
        const ImfHeader* inputFileHeaderPtr = ImfInputHeader (in);
        int xMin, yMin, xMax, yMax;
        ImfHeaderDataWindow (inputFileHeaderPtr, &xMin, &yMin, &xMax, &yMax);

        int w  = xMax - xMin + 1;
        int h  = yMax - yMin + 1;
        int dx = xMin;
        int dy = yMin;

        Array2D<ImfRgba> p2 (h, w);
        for (int y = 0; y < h; ++y)
        {
            for (int x = 0; x < w; ++x)
            {
                p2[y][x] = {0, 0, 0, 1};
            }
        }
        int successSetFrameBuffer = ImfInputSetFrameBuffer (in, &p2[-dy][-dx], 1, w);
        assert (successSetFrameBuffer == 1);
        int successReadPixels = ImfInputReadPixels (in, yMin, yMax);
        assert (successReadPixels == 1);

        // Get inputFile dataWindow
        int xMinDataWindow, yMinDataWindow, xMaxDataWindow, yMaxDataWindow;
        ImfHeaderDataWindow (inputFileHeaderPtr, &xMinDataWindow, &yMinDataWindow, &xMaxDataWindow, &yMaxDataWindow);

        // Get inputFile displayWindow
        int xMinDisplayWindow, yMinDisplayWindow, xMaxDisplayWindow, yMaxDisplayWindow;
        ImfHeaderDisplayWindow (inputFileHeaderPtr, &xMinDisplayWindow, &yMinDisplayWindow, &xMaxDisplayWindow, &yMaxDisplayWindow);

        // Get inputFile screenWindowCenter
        float xScreenWindowCenter, yScreenWindowCenter;
        ImfHeaderScreenWindowCenter (inputFileHeaderPtr, &xScreenWindowCenter, &yScreenWindowCenter);

        // Compare displayWindow
        assert ((xMinDisplayWindow == 0) && (yMinDisplayWindow == 0) && (xMaxDisplayWindow == width - 1) && (yMaxDisplayWindow == height - 1));
        // Compare dataWindow
        assert ((xMinDataWindow == 0) && (yMinDataWindow == 0) && (xMaxDataWindow == width - 1) && (yMaxDataWindow == height - 1));
        // Compare pixelAspectRatio
        assert (ImfHeaderPixelAspectRatio(inputFileHeaderPtr) == ImfHeaderPixelAspectRatio (headerPtr));
        // Compare screenWindowCenter
        assert ((xScreenWindowCenter == xScreenWindowCenterOut) && (yScreenWindowCenter == yScreenWindowCenterOut));
        // Compare screenWindowWidth
        assert (ImfHeaderScreenWindowWidth (inputFileHeaderPtr) == ImfHeaderScreenWindowWidth (headerPtr));
        // Compare lineOrder
        assert (ImfHeaderLineOrder (inputFileHeaderPtr) == ImfHeaderLineOrder (headerPtr));
        // Compare compression
        assert (ImfHeaderCompression (inputFileHeaderPtr) == ImfHeaderCompression (headerPtr));
        // Compare channels
        assert(ImfInputChannels (in) == channels);

        if (ImfHeaderCompression(inputFileHeaderPtr) == IMF_B44_COMPRESSION ||
            ImfHeaderCompression(inputFileHeaderPtr) == IMF_B44A_COMPRESSION)
        {
            Array2D<Rgba> p1_temp (h,w);
            Array2D<Rgba> p2_temp (h,w);
            convertImfRgbaToRgbaPixels (p1, p1_temp, w, h);
            convertImfRgbaToRgbaPixels (p2, p2_temp, w, h);
            compareB44 (width, height, p1_temp, p2_temp, channels);
        }
        else if (
            ImfHeaderCompression (inputFileHeaderPtr) == IMF_DWAA_COMPRESSION ||
            ImfHeaderCompression (inputFileHeaderPtr) == IMF_DWAB_COMPRESSION)
        {
            Array2D<Rgba> p1_temp (h, w);
            Array2D<Rgba> p2_temp (h, w);
            convertImfRgbaToRgbaPixels (p1, p1_temp, w, h);
            convertImfRgbaToRgbaPixels (p2, p2_temp, w, h);
            compareDwa (width, height, p1_temp, p2_temp, channels);
        }
        else
        {
            for (int y = 0; y < h; ++y)
            {
                for (int x = 0; x < w; ++x)
                {  
                    if (channels & IMF_WRITE_R)
                        assert (p2[y][x].r == p1[y][x].r);
                    else
                        assert (ImfHalfToFloat(p2[y][x].r) == 0.0);

                    if (channels & IMF_WRITE_G)
                        assert (p2[y][x].g == p1[y][x].g);
                    else
                        assert (ImfHalfToFloat(p2[y][x].g) == 0.0);

                    if (channels & IMF_WRITE_B)
                        assert (p2[y][x].b == p1[y][x].b);
                    else
                        assert (ImfHalfToFloat(p2[y][x].b) == 0.0);

                    if (channels & IMF_WRITE_A) 
                        assert (p2[y][x].a == p1[y][x].a);
                    else
                        assert (ImfHalfToFloat(p2[y][x].a) == 1.0);       
                }
            }
        }

        int inputFileClosed = ImfCloseInputFile (in);
        assert (inputFileClosed == 1);
    }
    ImfDeleteHeader(headerPtr);
    remove (fileName);
}